

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpatialMotionVector.cpp
# Opt level: O1

double __thiscall iDynTree::SpatialMotionVector::exp(SpatialMotionVector *this,double __x)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double *in_RSI;
  PointerType ptr;
  double __x_00;
  double extraout_XMM0_Qa;
  Position newPos;
  Matrix3x3 J_SO3;
  Position local_d8;
  Matrix3x3 local_b8;
  Rotation local_70;
  
  Transform::Transform((Transform *)this);
  Position::Position(&local_d8);
  Rotation::leftJacobian(&local_b8,(AngularMotionVector3 *)(in_RSI + 3));
  dVar2 = *in_RSI;
  dVar3 = in_RSI[1];
  dVar1 = in_RSI[2];
  local_d8.super_Vector3.m_data[0] =
       local_b8.m_data[2] * dVar1 + local_b8.m_data[1] * dVar3 + local_b8.m_data[0] * dVar2;
  local_d8.super_Vector3.m_data[1] =
       local_b8.m_data[5] * dVar1 + local_b8.m_data[4] * dVar3 + local_b8.m_data[3] * dVar2;
  local_d8.super_Vector3.m_data[2] =
       dVar1 * local_b8.m_data[8] + dVar3 * local_b8.m_data[7] + dVar2 * local_b8.m_data[6];
  Transform::setPosition((Transform *)this,&local_d8);
  GeomVector3::exp((GeomVector3 *)&local_70,__x_00);
  Transform::setRotation((Transform *)this,&local_70);
  return extraout_XMM0_Qa;
}

Assistant:

Transform SpatialMotionVector::exp() const
{
    Transform res;

    // the linear part is affected by the left Jacobian of SO(3)
    Position newPos;
    auto J_SO3 = Rotation::leftJacobian(this->getAngularVec3());
    toEigen(newPos) = toEigen(J_SO3)*toEigen(this->getLinearVec3());
    res.setPosition(newPos);

    // the angular part instead mapped by so(3) -> SO(3) exp map
    res.setRotation(this->getAngularVec3().exp());

    return res;
}